

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O0

int rebalance(vmd_bst_t *tree,vmd_bst_node_t *node)

{
  vmd_bst_node_t *node_00;
  uint dir_00;
  bool bVar1;
  vmd_bst_node_t *local_50;
  int ret;
  vmd_bst_node_t *r;
  int dbl;
  vmd_bst_node_t *c;
  int dir;
  vmd_bst_node_t *node_local;
  vmd_bst_t *tree_local;
  
  if (((char)(node->field_0x20 << 5) >> 5 < -1) || ('\x01' < (char)(node->field_0x20 << 5) >> 5)) {
    dir_00 = (uint)('\0' < (char)(node->field_0x20 << 5) >> 5);
    node_00 = node->child[(int)(uint)((dir_00 != 0 ^ 0xffU) & 1)];
    bVar1 = false;
    if ((char)(node_00->field_0x20 << 5) >> 5 != '\0') {
      bVar1 = '\0' < (char)(node->field_0x20 << 5) >> 5 !=
              '\0' < (char)(node_00->field_0x20 << 5) >> 5;
    }
    local_50 = node_00;
    if (bVar1) {
      local_50 = node_00->child[(int)dir_00];
    }
    tree_local._4_4_ = (int)((char)(node_00->field_0x20 << 5) >> 5);
    set_child(node->parent,(uint)((byte)node->field_0x20 >> 3 & 1),local_50);
    set_child(node,(uint)((dir_00 != 0 ^ 0xffU) & 1),local_50->child[(int)dir_00]);
    set_child(local_50,dir_00,node);
    if (bVar1) {
      set_child(node_00,dir_00,local_50->child[(int)(uint)((dir_00 != 0 ^ 0xffU) & 1)]);
      set_child(local_50,(uint)((dir_00 != 0 ^ 0xffU) & 1),node_00);
      if (tree->upd != (vmd_bst_upd_t)0x0) {
        (*tree->upd)(node_00);
      }
      node->field_0x20 = node->field_0x20 & 0xf8;
      node_00->field_0x20 = node_00->field_0x20 & 0xf8;
      if ((char)(local_50->field_0x20 << 5) >> 5 != '\0') {
        if (dir_00 == '\0' < (char)(local_50->field_0x20 << 5) >> 5) {
          node->field_0x20 =
               node->field_0x20 & 0xf8 | -((char)(local_50->field_0x20 << 5) >> 5) & 7U;
        }
        else {
          node_00->field_0x20 =
               node_00->field_0x20 & 0xf8 | -((char)(local_50->field_0x20 << 5) >> 5) & 7U;
        }
        local_50->field_0x20 = local_50->field_0x20 & 0xf8;
      }
    }
    else if ((char)(node_00->field_0x20 << 5) >> 5 == '\0') {
      if (dir_00 == 0) {
        node->field_0x20 = node->field_0x20 & 0xf8 | 7;
        node_00->field_0x20 = node_00->field_0x20 & 0xf8 | 1;
      }
      else {
        node->field_0x20 = node->field_0x20 & 0xf8 | 1;
        node_00->field_0x20 = node_00->field_0x20 & 0xf8 | 7;
      }
    }
    else {
      node_00->field_0x20 = node_00->field_0x20 & 0xf8;
      node->field_0x20 = node->field_0x20 & 0xf8;
    }
    update_to_top(tree,node);
  }
  else {
    tree_local._4_4_ = 0;
  }
  return tree_local._4_4_;
}

Assistant:

static int
rebalance(bst_t *tree, bst_node_t *node)
{
	if (node->balance >= -1 && node->balance <= 1)
		return 0;

	int dir = node->balance > 0;
	bst_node_t *c = node->child[!dir];
	int dbl = c->balance && ((node->balance > 0) != (c->balance > 0));
	bst_node_t *r = dbl ? c->child[dir] : c;

	/* rotation doesn't change the subtree height if c->balance == 0 */
	int ret = c->balance;

	set_child(node->parent, node->idx, r);
	set_child(node, !dir, r->child[dir]);
	set_child(r, dir, node);

	if (dbl) {
		set_child(c, dir, r->child[!dir]);
		set_child(r, !dir, c);

		if (tree->upd)
			tree->upd(c);

		node->balance = 0;
		c->balance = 0;
		if (r->balance) {
			if (dir == (r->balance > 0))
				node->balance = -(r->balance);
			else
				c->balance = -(r->balance);
			r->balance = 0;
		}
	} else {
		if (c->balance)
			node->balance = c->balance = 0;
		else if (dir) {
			node->balance = 1;
			c->balance = -1;
		} else {
			node->balance = -1;
			c->balance = 1;
		}
	}

	update_to_top(tree, node);

	return ret;
}